

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O1

void str_hash_init_sse42(void)

{
  long lVar1;
  __pid_t _Var2;
  time_t tVar3;
  long lVar4;
  undefined4 uVar5;
  uint uVar6;
  long lVar7;
  
  hash_sparse = hash_sparse_sse42;
  hash_dense = hash_dense_sse42;
  _Var2 = getpid();
  uVar5 = crc32(0,_Var2);
  tVar3 = time((time_t *)0x0);
  uVar6 = crc32(uVar5,(int)tVar3);
  srandom(uVar6);
  random_pos[0][0] = 0;
  random_pos[0][1] = 0;
  random_pos[1][0] = 0;
  random_pos[1][1] = 0;
  random_pos[2][0] = 0;
  random_pos[2][1] = 0;
  lVar7 = 3;
  do {
    lVar4 = random();
    lVar1 = lVar7 + 1;
    uVar6 = ~(uint)(-2L << ((byte)lVar7 & 0x3f));
    random_pos[lVar7][0] = (uint)lVar4 & uVar6;
    lVar4 = random();
    random_pos[lVar7][1] = (uint)lVar4 & uVar6;
    lVar7 = lVar1;
  } while (lVar1 != 0x1f);
  return;
}

Assistant:

void str_hash_init_sse42(void)
{
  hash_sparse = hash_sparse_sse42;
#if LUAJIT_SECURITY_STRHASH
  hash_dense = hash_dense_sse42;
#endif
  str_hash_init_random();
}